

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.cxx
# Opt level: O1

uint16_t __thiscall xray_re::_vector3<float>::compress(_vector3<float> *this)

{
  int iVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if (initialized == '\0') {
    initialize();
  }
  fVar9 = (this->field_0).field_0.x;
  fVar7 = (this->field_0).field_0.y;
  fVar5 = -fVar9;
  fVar6 = fVar5;
  if (fVar5 <= fVar9) {
    fVar6 = fVar9;
  }
  uVar2 = (ushort)(fVar9 < fVar5) * -0x8000;
  fVar9 = -fVar7;
  uVar3 = uVar2 + 0x4000;
  if (fVar9 <= fVar7) {
    uVar3 = uVar2;
  }
  fVar5 = (this->field_0).field_0.z;
  fVar8 = -fVar5;
  uVar2 = uVar3 + 0x2000;
  if (fVar8 <= fVar5) {
    uVar2 = uVar3;
  }
  if (fVar9 <= fVar7) {
    fVar9 = fVar7;
  }
  if (fVar8 <= fVar5) {
    fVar8 = fVar5;
  }
  fVar5 = 126.0 / (fVar6 + fVar9 + fVar8);
  fVar7 = floorf(fVar6 * fVar5);
  iVar4 = (int)fVar7;
  fVar9 = floorf(fVar5 * fVar9);
  uVar3 = 0x7f - (ushort)(int)fVar9;
  iVar1 = 0x7f - iVar4;
  if (iVar4 < 0x40) {
    uVar3 = (ushort)(int)fVar9;
    iVar1 = iVar4;
  }
  return uVar3 | uVar2 | (ushort)(iVar1 << 7);
}

Assistant:

uint16_t _vector3<float>::compress() const
{
	if (!initialized)
		initialize();

	uint16_t s = 0;
	float _x, _y, _z;
	if ((_x = x) < 0) {
		_x = -_x;
		s |= 0x8000;
	}
	if ((_y = y) < 0) {
		_y = -_y;
		s |= 0x4000;
	}
	if ((_z = z) < 0) {
		_z = -_z;
		s |= 0x2000;
	}
	float adj = 126.f/(_x + _y + _z);
	int u = int(std::floor(_x * adj));
	int v = int(std::floor(_y * adj));
	if (u > 63) {
		u = 127 - u;
		v = 127 - v;
	}
	return (u << 7) | v | s;
}